

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextBuildNodesFromSettings
               (ImGuiContext *ctx,ImGuiDockNodeSettings *node_settings_array,int node_settings_count
               )

{
  short sVar1;
  ImU32 key;
  ImGuiDockNode *pIVar2;
  ImGuiDockNode *pIVar3;
  ImGuiDockNode **ppIVar4;
  ImGuiWindow *pIVar5;
  ImGuiDockNode *pIVar6;
  ulong uVar7;
  char host_window_title [20];
  char local_48 [24];
  
  if (0 < node_settings_count) {
    uVar7 = 0;
    do {
      if (node_settings_array[uVar7].ID != 0) {
        pIVar2 = DockContextAddNode(ctx,node_settings_array[uVar7].ID);
        if (node_settings_array[uVar7].ParentNodeId == 0) {
          pIVar3 = (ImGuiDockNode *)0x0;
        }
        else {
          pIVar3 = (ImGuiDockNode *)
                   ImGuiStorage::GetVoidPtr
                             (&(ctx->DockContext).Nodes,node_settings_array[uVar7].ParentNodeId);
        }
        pIVar2->ParentNode = pIVar3;
        sVar1 = node_settings_array[uVar7].Pos.y;
        (pIVar2->Pos).x = (float)(int)node_settings_array[uVar7].Pos.x;
        (pIVar2->Pos).y = (float)(int)sVar1;
        sVar1 = node_settings_array[uVar7].Size.y;
        (pIVar2->Size).x = (float)(int)node_settings_array[uVar7].Size.x;
        (pIVar2->Size).y = (float)(int)sVar1;
        sVar1 = node_settings_array[uVar7].SizeRef.y;
        (pIVar2->SizeRef).x = (float)(int)node_settings_array[uVar7].SizeRef.x;
        (pIVar2->SizeRef).y = (float)(int)sVar1;
        *(ushort *)&pIVar2->field_0xb8 = (ushort)*(undefined4 *)&pIVar2->field_0xb8 & 0xfe00 | 0x49;
        if (pIVar3 != (ImGuiDockNode *)0x0) {
          if (pIVar3->ChildNodes[0] == (ImGuiDockNode *)0x0) {
            ppIVar4 = pIVar3->ChildNodes;
          }
          else {
            if ((pIVar3 == (ImGuiDockNode *)0x0) || (pIVar3->ChildNodes[1] != (ImGuiDockNode *)0x0))
            goto LAB_0013bc55;
            ppIVar4 = pIVar3->ChildNodes + 1;
          }
          *ppIVar4 = pIVar2;
        }
LAB_0013bc55:
        pIVar2->SelectedTabId = node_settings_array[uVar7].SelectedWindowId;
        pIVar2->SplitAxis = (int)node_settings_array[uVar7].SplitAxis;
        pIVar2->LocalFlags = pIVar2->LocalFlags | node_settings_array[uVar7].Flags & 0x61fc20U;
        pIVar3 = pIVar2;
        do {
          pIVar6 = pIVar3;
          pIVar3 = pIVar6->ParentNode;
        } while (pIVar3 != (ImGuiDockNode *)0x0);
        ImFormatString(local_48,0x14,"##DockNode_%02X",(ulong)pIVar6->ID);
        key = ImHashStr(local_48,0,0);
        pIVar5 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
        pIVar2->HostWindow = pIVar5;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)node_settings_count);
  }
  return;
}

Assistant:

static void ImGui::DockContextBuildNodesFromSettings(ImGuiContext* ctx, ImGuiDockNodeSettings* node_settings_array, int node_settings_count)
{
    // Build nodes
    for (int node_n = 0; node_n < node_settings_count; node_n++)
    {
        ImGuiDockNodeSettings* settings = &node_settings_array[node_n];
        if (settings->ID == 0)
            continue;
        ImGuiDockNode* node = DockContextAddNode(ctx, settings->ID);
        node->ParentNode = settings->ParentNodeId ? DockContextFindNodeByID(ctx, settings->ParentNodeId) : NULL;
        node->Pos = ImVec2(settings->Pos.x, settings->Pos.y);
        node->Size = ImVec2(settings->Size.x, settings->Size.y);
        node->SizeRef = ImVec2(settings->SizeRef.x, settings->SizeRef.y);
        node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_DockNode;
        if (node->ParentNode && node->ParentNode->ChildNodes[0] == NULL)
            node->ParentNode->ChildNodes[0] = node;
        else if (node->ParentNode && node->ParentNode->ChildNodes[1] == NULL)
            node->ParentNode->ChildNodes[1] = node;
        node->SelectedTabId = settings->SelectedWindowId;
        node->SplitAxis = (ImGuiAxis)settings->SplitAxis;
        node->LocalFlags |= (settings->Flags & ImGuiDockNodeFlags_SavedFlagsMask_);

        // Bind host window immediately if it already exist (in case of a rebuild)
        // This is useful as the RootWindowForTitleBarHighlight links necessary to highlight the currently focused node requires node->HostWindow to be set.
        char host_window_title[20];
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        node->HostWindow = FindWindowByName(DockNodeGetHostWindowTitle(root_node, host_window_title, IM_ARRAYSIZE(host_window_title)));
    }
}